

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O0

AtomicSort ** __thiscall
Lib::Set<Kernel::AtomicSort*,Indexing::TermSharing>::
rawFindOrInsert<Kernel::AtomicSort::create(unsigned_int,unsigned_int,Kernel::TermList_const*)::__1,Kernel::AtomicSort::create(unsigned_int,unsigned_int,Kernel::TermList_const*)::__2>
          (Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *this,anon_class_24_3_776da329 create,
          uint hashCode,anon_class_24_3_7d9c329f isCorrectVal,bool *inserted)

{
  bool bVar1;
  uint code;
  AtomicSort *pAVar2;
  Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *in_RDX;
  uint in_ESI;
  Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *in_RDI;
  Cell *cell;
  Cell *found;
  anon_class_24_3_776da329 *in_stack_00000030;
  anon_class_1_0_00000001 correctHash;
  Cell *local_38;
  Cell *local_30;
  anon_class_1_0_00000001 local_21;
  undefined4 in_stack_ffffffffffffffe8;
  Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *this_00;
  AtomicSort **local_8;
  
  *(undefined1 *)&in_RDX->_capacity = 0;
  this_00 = in_RDI;
  code = Set<Kernel::AtomicSort_*,_Indexing::TermSharing>::
         rawFindOrInsert<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/Term.cpp:1383:20),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/Term.cpp:1397:9)>
         ::anon_class_1_0_00000001::operator()(&local_21,in_ESI);
  if (in_RDI->_maxEntries <= in_RDI->_nonemptyCells) {
    Set<Kernel::AtomicSort_*,_Indexing::TermSharing>::expand(in_RDX);
  }
  local_30 = (Cell *)0x0;
  local_38 = Set<Kernel::AtomicSort_*,_Indexing::TermSharing>::firstCellForCode(in_RDI,code);
  while (bVar1 = Set<Kernel::AtomicSort_*,_Indexing::TermSharing>::Cell::empty(local_38),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = Set<Kernel::AtomicSort_*,_Indexing::TermSharing>::Cell::deleted(local_38);
    if (bVar1) {
      if (local_30 == (Cell *)0x0) {
        local_30 = local_38;
      }
      local_38 = Set<Kernel::AtomicSort_*,_Indexing::TermSharing>::nextCell(in_RDI,local_38);
    }
    else {
      if ((local_38->code == code) &&
         (bVar1 = Kernel::AtomicSort::create::anon_class_24_3_7d9c329f::operator()
                            ((anon_class_24_3_7d9c329f *)this_00,
                             (AtomicSort *)CONCAT44(code,in_stack_ffffffffffffffe8)), bVar1))
      goto LAB_009888d3;
      local_38 = Set<Kernel::AtomicSort_*,_Indexing::TermSharing>::nextCell(in_RDI,local_38);
    }
  }
  if (local_30 == (Cell *)0x0) {
    in_RDI->_nonemptyCells = in_RDI->_nonemptyCells + 1;
  }
  else {
    local_38 = local_30;
  }
  in_RDI->_size = in_RDI->_size + 1;
  pAVar2 = Kernel::AtomicSort::create::anon_class_24_3_776da329::operator()(in_stack_00000030);
  local_38->value = pAVar2;
  local_38->code = code;
  *(undefined1 *)&in_RDX->_capacity = 1;
LAB_009888d3:
  local_8 = &local_38->value;
  return local_8;
}

Assistant:

Val& rawFindOrInsert(Create create, unsigned hashCode, IsCorrectVal isCorrectVal, bool& inserted)
  {
    inserted = false;

    auto correctHash = [](unsigned hash) { return hash < 2 ? 2 : hash; };
    hashCode = correctHash(hashCode);
    if (_nonemptyCells >= _maxEntries) { // too many entries
      expand();
    }

    Cell* found = 0;
    Cell* cell = firstCellForCode(hashCode);
    while (! cell->empty()) {
      if (cell->deleted()) {
        if (! found) {
          found = cell;
        }
        cell = nextCell(cell);
        continue;
      }
      if (cell->code == hashCode && isCorrectVal(cell->value)) {
        return cell->value;
      }
      cell = nextCell(cell);
    }
    if (found) { // cell deleted
      cell = found;
    }
    else { // cell is empty
      _nonemptyCells++;
    }
    _size++;
    cell->value = create();
    cell->code = hashCode;
    inserted = true;
    ASS_REP(correctHash(Hash::hash(cell->value)) == hashCode, cell->value)
    return cell->value;
  }